

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O0

undefined8 adios2::helper::CommDupMPI(MPI_Comm mpiComm)

{
  undefined *in_RSI;
  undefined8 in_RDI;
  MPI_Comm newComm;
  undefined *local_18 [3];
  
  if (in_RSI == &ompi_mpi_comm_null) {
    local_18[0] = &ompi_mpi_comm_null;
  }
  else {
    MPI_Comm_dup(in_RSI,local_18);
  }
  CommWithMPI(mpiComm);
  return in_RDI;
}

Assistant:

Comm CommDupMPI(MPI_Comm mpiComm)
{
    MPI_Comm newComm;
    if (mpiComm != MPI_COMM_NULL)
    {
        MPI_Comm_dup(mpiComm, &newComm);
    }
    else
    {
        newComm = MPI_COMM_NULL;
    }
    return CommWithMPI(newComm);
}